

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  ParameterValueAssignmentSyntax *node;
  VirtualInterfaceTypeSyntax *pVVar2;
  Token TVar3;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  ParameterValueAssignmentSyntax *in_stack_ffffffffffffffa0;
  Info *args_4;
  
  TVar3 = parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  args_4 = TVar3.info;
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  if (((Token *)((long)__fn + 0x40))->info == (Info *)0x0) {
    node = (ParameterValueAssignmentSyntax *)0x0;
  }
  else {
    node = deepClone<slang::syntax::ParameterValueAssignmentSyntax>
                     (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  }
  lVar1._0_2_ = ((Token *)((long)__fn + 0x50))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x50))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x50))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x50))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::DotMemberClauseSyntax>
              ((DotMemberClauseSyntax *)node,in_stack_ffffffffffffff98);
  }
  pVVar2 = BumpAllocator::
           emplace<slang::syntax::VirtualInterfaceTypeSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ParameterValueAssignmentSyntax*,slang::syntax::DotMemberClauseSyntax*>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(Token *)__fn,
                      (ParameterValueAssignmentSyntax **)__child_stack,
                      (DotMemberClauseSyntax **)args_4);
  return (int)pVVar2;
}

Assistant:

static SyntaxNode* clone(const VirtualInterfaceTypeSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<VirtualInterfaceTypeSyntax>(
        node.virtualKeyword.deepClone(alloc),
        node.interfaceKeyword.deepClone(alloc),
        node.name.deepClone(alloc),
        node.parameters ? deepClone(*node.parameters, alloc) : nullptr,
        node.modport ? deepClone(*node.modport, alloc) : nullptr
    );
}